

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.cpp
# Opt level: O1

void __thiscall
duckdb::roaring::ContainerCompressionState::ContainerCompressionState
          (ContainerCompressionState *this)

{
  this->length = 0;
  this->run_idx = 0;
  this->array_idx[0] = 0;
  this->array_idx[1] = 0;
  this->appended_count = 0;
  this->null_count = 0;
  this->last_is_null = false;
  this->finalized = false;
  this->arrays[1] = this->base_arrays[1];
  this->arrays[0] = this->base_arrays[0];
  this->runs = this->base_runs;
  this->compressed_arrays[1] = this->base_compressed_arrays[1];
  this->compressed_arrays[0] = this->base_compressed_arrays[0];
  this->compressed_runs = this->base_compressed_runs;
  this->array_counts[1] = this->base_array_counts[1];
  this->array_counts[0] = this->base_array_counts[0];
  this->run_counts = this->base_run_counts;
  this->base_run_counts[0] = '\0';
  this->base_run_counts[1] = '\0';
  this->base_run_counts[2] = '\0';
  this->base_run_counts[3] = '\0';
  this->base_run_counts[4] = '\0';
  this->base_run_counts[5] = '\0';
  this->base_run_counts[6] = '\0';
  this->base_run_counts[7] = '\0';
  this->uncompressed = (validity_t *)0x0;
  this->base_array_counts[0] = (uint8_t  [8])0x0;
  this->base_array_counts[1] = (uint8_t  [8])0x0;
  return;
}

Assistant:

ContainerCompressionState::ContainerCompressionState() {
	Reset();
}